

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O0

void start_pass_huff_decoder(j_decompress_ptr cinfo)

{
  int iVar1;
  jpeg_entropy_decoder *pjVar2;
  jpeg_component_info *pjVar3;
  int (*paiVar4) [64];
  int local_48;
  int expected;
  int *coef_bit_ptr;
  int cindex;
  int coefi;
  jpeg_component_info *compptr;
  int i;
  int tbl;
  int blkn;
  int ci;
  huff_entropy_ptr entropy;
  j_decompress_ptr cinfo_local;
  
  pjVar2 = cinfo->entropy;
  if (cinfo->progressive_mode == 0) {
    if ((((cinfo->Ss != 0) || (cinfo->Ah != 0)) || (cinfo->Al != 0)) ||
       (((cinfo->is_baseline != 0 || (cinfo->Se < 0x40)) && (cinfo->Se != cinfo->lim_Se)))) {
      cinfo->err->msg_code = 0x7d;
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
    }
    if (cinfo->lim_Se == 0x3f) {
      pjVar2->decode_mcu = decode_mcu;
    }
    else {
      pjVar2->decode_mcu = decode_mcu_sub;
    }
    for (tbl = 0; tbl < cinfo->comps_in_scan; tbl = tbl + 1) {
      pjVar3 = cinfo->cur_comp_info[tbl];
      iVar1 = pjVar3->dc_tbl_no;
      jpeg_make_d_derived_tbl(cinfo,1,iVar1,(d_derived_tbl **)(&pjVar2[6].decode_mcu + iVar1));
      if (cinfo->lim_Se != 0) {
        iVar1 = pjVar3->ac_tbl_no;
        jpeg_make_d_derived_tbl(cinfo,0,iVar1,(d_derived_tbl **)(&pjVar2[8].decode_mcu + iVar1));
      }
      *(undefined4 *)((long)&pjVar2[2].start_pass + (long)tbl * 4 + 4) = 0;
    }
    for (i = 0; i < cinfo->blocks_in_MCU; i = i + 1) {
      pjVar3 = cinfo->cur_comp_info[cinfo->MCU_membership[i]];
      (&pjVar2[10].decode_mcu)[i] = (&pjVar2[6].decode_mcu)[pjVar3->dc_tbl_no];
      (&pjVar2[0xf].decode_mcu)[i] = (&pjVar2[8].decode_mcu)[pjVar3->ac_tbl_no];
      if (pjVar3->component_needed == 0) {
        *(undefined4 *)((long)&pjVar2[0x14].decode_mcu + (long)i * 4) = 0;
      }
      else {
        tbl = pjVar3->DCT_v_scaled_size;
        compptr._0_4_ = pjVar3->DCT_h_scaled_size;
        switch(cinfo->lim_Se) {
        case 0:
          *(undefined4 *)((long)&pjVar2[0x14].decode_mcu + (long)i * 4) = 1;
          break;
        default:
          if ((tbl < 1) || (8 < tbl)) {
            tbl = 8;
          }
          if (((int)compptr < 1) || (8 < (int)compptr)) {
            compptr._0_4_ = 8;
          }
          *(int *)((long)&pjVar2[0x14].decode_mcu + (long)i * 4) =
               jpeg_zigzag_order[tbl + -1][(int)compptr + -1] + 1;
          break;
        case 3:
          if ((tbl < 1) || (2 < tbl)) {
            tbl = 2;
          }
          if (((int)compptr < 1) || (2 < (int)compptr)) {
            compptr._0_4_ = 2;
          }
          *(int *)((long)&pjVar2[0x14].decode_mcu + (long)i * 4) =
               jpeg_zigzag_order2[tbl + -1][(int)compptr + -1] + 1;
          break;
        case 8:
          if ((tbl < 1) || (3 < tbl)) {
            tbl = 3;
          }
          if (((int)compptr < 1) || (3 < (int)compptr)) {
            compptr._0_4_ = 3;
          }
          *(int *)((long)&pjVar2[0x14].decode_mcu + (long)i * 4) =
               jpeg_zigzag_order3[tbl + -1][(int)compptr + -1] + 1;
          break;
        case 0xf:
          if ((tbl < 1) || (4 < tbl)) {
            tbl = 4;
          }
          if (((int)compptr < 1) || (4 < (int)compptr)) {
            compptr._0_4_ = 4;
          }
          *(int *)((long)&pjVar2[0x14].decode_mcu + (long)i * 4) =
               jpeg_zigzag_order4[tbl + -1][(int)compptr + -1] + 1;
          break;
        case 0x18:
          if ((tbl < 1) || (5 < tbl)) {
            tbl = 5;
          }
          if (((int)compptr < 1) || (5 < (int)compptr)) {
            compptr._0_4_ = 5;
          }
          *(int *)((long)&pjVar2[0x14].decode_mcu + (long)i * 4) =
               jpeg_zigzag_order5[tbl + -1][(int)compptr + -1] + 1;
          break;
        case 0x23:
          if ((tbl < 1) || (6 < tbl)) {
            tbl = 6;
          }
          if (((int)compptr < 1) || (6 < (int)compptr)) {
            compptr._0_4_ = 6;
          }
          *(int *)((long)&pjVar2[0x14].decode_mcu + (long)i * 4) =
               jpeg_zigzag_order6[tbl + -1][(int)compptr + -1] + 1;
          break;
        case 0x30:
          if ((tbl < 1) || (7 < tbl)) {
            tbl = 7;
          }
          if (((int)compptr < 1) || (7 < (int)compptr)) {
            compptr._0_4_ = 7;
          }
          *(int *)((long)&pjVar2[0x14].decode_mcu + (long)i * 4) =
               jpeg_zigzag_order7[tbl + -1][(int)compptr + -1] + 1;
        }
      }
    }
    goto LAB_0011aa80;
  }
  if (cinfo->Ss == 0) {
    if (cinfo->Se != 0) goto LAB_0011a252;
LAB_0011a219:
    if (((cinfo->Ah != 0) && (cinfo->Ah + -1 != cinfo->Al)) || (0xd < cinfo->Al)) goto LAB_0011a252;
  }
  else {
    if (((cinfo->Ss <= cinfo->Se) && (cinfo->Se <= cinfo->lim_Se)) && (cinfo->comps_in_scan == 1))
    goto LAB_0011a219;
LAB_0011a252:
    cinfo->err->msg_code = 0x11;
    (cinfo->err->msg_parm).i[0] = cinfo->Ss;
    (cinfo->err->msg_parm).i[1] = cinfo->Se;
    (cinfo->err->msg_parm).i[2] = cinfo->Ah;
    (cinfo->err->msg_parm).i[3] = cinfo->Al;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  for (tbl = 0; tbl < cinfo->comps_in_scan; tbl = tbl + 1) {
    iVar1 = cinfo->cur_comp_info[tbl]->component_index;
    paiVar4 = cinfo->coef_bits + iVar1;
    if ((cinfo->Ss != 0) && ((*paiVar4)[0] < 0)) {
      cinfo->err->msg_code = 0x76;
      (cinfo->err->msg_parm).i[0] = iVar1;
      (cinfo->err->msg_parm).i[1] = 0;
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
    }
    for (coef_bit_ptr._4_4_ = cinfo->Ss; coef_bit_ptr._4_4_ <= cinfo->Se;
        coef_bit_ptr._4_4_ = coef_bit_ptr._4_4_ + 1) {
      if ((*paiVar4)[coef_bit_ptr._4_4_] < 0) {
        local_48 = 0;
      }
      else {
        local_48 = (*paiVar4)[coef_bit_ptr._4_4_];
      }
      if (cinfo->Ah != local_48) {
        cinfo->err->msg_code = 0x76;
        (cinfo->err->msg_parm).i[0] = iVar1;
        (cinfo->err->msg_parm).i[1] = coef_bit_ptr._4_4_;
        (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
      }
      (*paiVar4)[coef_bit_ptr._4_4_] = cinfo->Al;
    }
  }
  if (cinfo->Ah == 0) {
    if (cinfo->Ss == 0) {
      pjVar2->decode_mcu = decode_mcu_DC_first;
    }
    else {
      pjVar2->decode_mcu = decode_mcu_AC_first;
    }
  }
  else if (cinfo->Ss == 0) {
    pjVar2->decode_mcu = decode_mcu_DC_refine;
  }
  else {
    pjVar2->decode_mcu = decode_mcu_AC_refine;
  }
  for (tbl = 0; tbl < cinfo->comps_in_scan; tbl = tbl + 1) {
    if (cinfo->Ss == 0) {
      if (cinfo->Ah == 0) {
        iVar1 = cinfo->cur_comp_info[tbl]->dc_tbl_no;
        jpeg_make_d_derived_tbl(cinfo,1,iVar1,(d_derived_tbl **)(&pjVar2[4].start_pass + iVar1));
      }
    }
    else {
      iVar1 = cinfo->cur_comp_info[tbl]->ac_tbl_no;
      jpeg_make_d_derived_tbl(cinfo,0,iVar1,(d_derived_tbl **)(&pjVar2[4].start_pass + iVar1));
      pjVar2[6].start_pass = (&pjVar2[4].start_pass)[iVar1];
    }
    *(undefined4 *)((long)&pjVar2[2].start_pass + (long)tbl * 4 + 4) = 0;
  }
  *(undefined4 *)&pjVar2[2].start_pass = 0;
LAB_0011aa80:
  *(undefined4 *)&pjVar2[1].decode_mcu = 0;
  pjVar2[1].start_pass = (_func_void_j_decompress_ptr *)0x0;
  *(undefined4 *)((long)&pjVar2[3].start_pass + 4) = 0;
  *(uint *)&pjVar2[3].decode_mcu = cinfo->restart_interval;
  return;
}

Assistant:

METHODDEF(void)
start_pass_huff_decoder (j_decompress_ptr cinfo)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  int ci, blkn, tbl, i;
  jpeg_component_info * compptr;

  if (cinfo->progressive_mode) {
    /* Validate progressive scan parameters */
    if (cinfo->Ss == 0) {
      if (cinfo->Se != 0)
	goto bad;
    } else {
      /* need not check Ss/Se < 0 since they came from unsigned bytes */
      if (cinfo->Se < cinfo->Ss || cinfo->Se > cinfo->lim_Se)
	goto bad;
      /* AC scans may have only one component */
      if (cinfo->comps_in_scan != 1)
	goto bad;
    }
    if (cinfo->Ah != 0) {
      /* Successive approximation refinement scan: must have Al = Ah-1. */
      if (cinfo->Ah-1 != cinfo->Al)
	goto bad;
    }
    if (cinfo->Al > 13) {	/* need not check for < 0 */
      /* Arguably the maximum Al value should be less than 13 for 8-bit precision,
       * but the spec doesn't say so, and we try to be liberal about what we
       * accept.  Note: large Al values could result in out-of-range DC
       * coefficients during early scans, leading to bizarre displays due to
       * overflows in the IDCT math.  But we won't crash.
       */
      bad:
      ERREXIT4(cinfo, JERR_BAD_PROGRESSION,
	       cinfo->Ss, cinfo->Se, cinfo->Ah, cinfo->Al);
    }
    /* Update progression status, and verify that scan order is legal.
     * Note that inter-scan inconsistencies are treated as warnings
     * not fatal errors ... not clear if this is right way to behave.
     */
    for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
      int coefi, cindex = cinfo->cur_comp_info[ci]->component_index;
      int *coef_bit_ptr = & cinfo->coef_bits[cindex][0];
      if (cinfo->Ss && coef_bit_ptr[0] < 0) /* AC without prior DC scan */
	WARNMS2(cinfo, JWRN_BOGUS_PROGRESSION, cindex, 0);
      for (coefi = cinfo->Ss; coefi <= cinfo->Se; coefi++) {
	int expected = (coef_bit_ptr[coefi] < 0) ? 0 : coef_bit_ptr[coefi];
	if (cinfo->Ah != expected)
	  WARNMS2(cinfo, JWRN_BOGUS_PROGRESSION, cindex, coefi);
	coef_bit_ptr[coefi] = cinfo->Al;
      }
    }

    /* Select MCU decoding routine */
    if (cinfo->Ah == 0) {
      if (cinfo->Ss == 0)
	entropy->pub.decode_mcu = decode_mcu_DC_first;
      else
	entropy->pub.decode_mcu = decode_mcu_AC_first;
    } else {
      if (cinfo->Ss == 0)
	entropy->pub.decode_mcu = decode_mcu_DC_refine;
      else
	entropy->pub.decode_mcu = decode_mcu_AC_refine;
    }

    for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
      compptr = cinfo->cur_comp_info[ci];
      /* Make sure requested tables are present, and compute derived tables.
       * We may build same derived table more than once, but it's not expensive.
       */
      if (cinfo->Ss == 0) {
	if (cinfo->Ah == 0) {	/* DC refinement needs no table */
	  tbl = compptr->dc_tbl_no;
	  jpeg_make_d_derived_tbl(cinfo, TRUE, tbl,
				  & entropy->derived_tbls[tbl]);
	}
      } else {
	tbl = compptr->ac_tbl_no;
	jpeg_make_d_derived_tbl(cinfo, FALSE, tbl,
				& entropy->derived_tbls[tbl]);
	/* remember the single active table */
	entropy->ac_derived_tbl = entropy->derived_tbls[tbl];
      }
      /* Initialize DC predictions to 0 */
      entropy->saved.last_dc_val[ci] = 0;
    }

    /* Initialize private state variables */
    entropy->saved.EOBRUN = 0;
  } else {
    /* Check that the scan parameters Ss, Se, Ah/Al are OK for sequential JPEG.
     * This ought to be an error condition, but we make it a warning because
     * there are some baseline files out there with all zeroes in these bytes.
     */
    if (cinfo->Ss != 0 || cinfo->Ah != 0 || cinfo->Al != 0 ||
	((cinfo->is_baseline || cinfo->Se < DCTSIZE2) &&
	cinfo->Se != cinfo->lim_Se))
      WARNMS(cinfo, JWRN_NOT_SEQUENTIAL);

    /* Select MCU decoding routine */
    /* We retain the hard-coded case for full-size blocks.
     * This is not necessary, but it appears that this version is slightly
     * more performant in the given implementation.
     * With an improved implementation we would prefer a single optimized
     * function.
     */
    if (cinfo->lim_Se != DCTSIZE2-1)
      entropy->pub.decode_mcu = decode_mcu_sub;
    else
      entropy->pub.decode_mcu = decode_mcu;

    for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
      compptr = cinfo->cur_comp_info[ci];
      /* Compute derived values for Huffman tables */
      /* We may do this more than once for a table, but it's not expensive */
      tbl = compptr->dc_tbl_no;
      jpeg_make_d_derived_tbl(cinfo, TRUE, tbl,
			      & entropy->dc_derived_tbls[tbl]);
      if (cinfo->lim_Se) {	/* AC needs no table when not present */
	tbl = compptr->ac_tbl_no;
	jpeg_make_d_derived_tbl(cinfo, FALSE, tbl,
				& entropy->ac_derived_tbls[tbl]);
      }
      /* Initialize DC predictions to 0 */
      entropy->saved.last_dc_val[ci] = 0;
    }

    /* Precalculate decoding info for each block in an MCU of this scan */
    for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
      ci = cinfo->MCU_membership[blkn];
      compptr = cinfo->cur_comp_info[ci];
      /* Precalculate which table to use for each block */
      entropy->dc_cur_tbls[blkn] = entropy->dc_derived_tbls[compptr->dc_tbl_no];
      entropy->ac_cur_tbls[blkn] = entropy->ac_derived_tbls[compptr->ac_tbl_no];
      /* Decide whether we really care about the coefficient values */
      if (compptr->component_needed) {
	ci = compptr->DCT_v_scaled_size;
	i = compptr->DCT_h_scaled_size;
	switch (cinfo->lim_Se) {
	case (1*1-1):
	  entropy->coef_limit[blkn] = 1;
	  break;
	case (2*2-1):
	  if (ci <= 0 || ci > 2) ci = 2;
	  if (i <= 0 || i > 2) i = 2;
	  entropy->coef_limit[blkn] = 1 + jpeg_zigzag_order2[ci - 1][i - 1];
	  break;
	case (3*3-1):
	  if (ci <= 0 || ci > 3) ci = 3;
	  if (i <= 0 || i > 3) i = 3;
	  entropy->coef_limit[blkn] = 1 + jpeg_zigzag_order3[ci - 1][i - 1];
	  break;
	case (4*4-1):
	  if (ci <= 0 || ci > 4) ci = 4;
	  if (i <= 0 || i > 4) i = 4;
	  entropy->coef_limit[blkn] = 1 + jpeg_zigzag_order4[ci - 1][i - 1];
	  break;
	case (5*5-1):
	  if (ci <= 0 || ci > 5) ci = 5;
	  if (i <= 0 || i > 5) i = 5;
	  entropy->coef_limit[blkn] = 1 + jpeg_zigzag_order5[ci - 1][i - 1];
	  break;
	case (6*6-1):
	  if (ci <= 0 || ci > 6) ci = 6;
	  if (i <= 0 || i > 6) i = 6;
	  entropy->coef_limit[blkn] = 1 + jpeg_zigzag_order6[ci - 1][i - 1];
	  break;
	case (7*7-1):
	  if (ci <= 0 || ci > 7) ci = 7;
	  if (i <= 0 || i > 7) i = 7;
	  entropy->coef_limit[blkn] = 1 + jpeg_zigzag_order7[ci - 1][i - 1];
	  break;
	default:
	  if (ci <= 0 || ci > 8) ci = 8;
	  if (i <= 0 || i > 8) i = 8;
	  entropy->coef_limit[blkn] = 1 + jpeg_zigzag_order[ci - 1][i - 1];
	  break;
	}
      } else {
	entropy->coef_limit[blkn] = 0;
      }
    }
  }

  /* Initialize bitread state variables */
  entropy->bitstate.bits_left = 0;
  entropy->bitstate.get_buffer = 0; /* unnecessary, but keeps Purify quiet */
  entropy->insufficient_data = FALSE;

  /* Initialize restart counter */
  entropy->restarts_to_go = cinfo->restart_interval;
}